

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhileStatement.h
# Opt level: O3

void __thiscall WhileStatement::execute(WhileStatement *this,Environment *env)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  Environment local;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  Environment::Environment((Environment *)&local_60,env);
  while( true ) {
    peVar1 = (this->condition).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**peVar1->_vptr_Expression)(&local_70,peVar1,&local_60);
    cVar3 = (**(code **)(*local_70 + 0x28))();
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (cVar3 == '\0') break;
    peVar2 = (this->statementBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**(peVar2->super_Statement)._vptr_Statement)(peVar2,&local_60);
  }
  std::
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  return;
}

Assistant:

void execute(Environment *env) override {
        Environment local = *env;
        while(condition->evaluate(&local) -> asBoolean()) {
            try {
                statementBlock->execute(&local);
            } catch (BreakPacket &) {
                break;
            } catch (ContinuePacket &) {}
        }
    }